

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

bool __thiscall
HighsLpRelaxation::computeDualProof
          (HighsLpRelaxation *this,HighsDomain *globaldomain,double upperbound,
          vector<int,_std::allocator<int>_> *inds,vector<double,_std::allocator<double>_> *vals,
          double *rhs,bool extractCliques)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  HighsMipSolver *pHVar6;
  HighsInt *pHVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  int iVar9;
  undefined3 in_register_00000089;
  HighsInt j;
  long lVar10;
  HighsInt i;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  HighsCDouble sum;
  double val;
  HighsCDouble upper;
  vector<double,_std::allocator<double>_> row_dual;
  int local_9c;
  vector<int,_std::allocator<int>_> *local_98;
  HighsDomain *local_90;
  vector<double,_std::allocator<double>_> *local_88;
  undefined4 local_7c;
  double *local_78;
  HighsCDouble local_70;
  double local_60;
  HighsCDouble local_58;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_98 = (vector<int,_std::allocator<int>_> *)upperbound;
  local_90 = globaldomain;
  local_88 = vals;
  local_78 = rhs;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             &(this->lpsolver).solution_.row_dual);
  local_58.hi = (double)local_98;
  local_58.lo = 0.0;
  for (uVar11 = 0; pvVar8 = local_88, uVar11 != (uint)(this->lpsolver).model_.lp_.num_row_;
      uVar11 = uVar11 + 1) {
    dVar13 = local_48._M_impl.super__Vector_impl_data._M_start[uVar11];
    if (dVar13 <= 0.0) {
      if (dVar13 < 0.0) {
        dVar12 = (this->lpsolver).model_.lp_.row_upper_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar11];
        if (INFINITY <= dVar12) goto LAB_002b77ca;
        goto LAB_002b779b;
      }
    }
    else {
      dVar12 = (this->lpsolver).model_.lp_.row_lower_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar11];
      if (dVar12 <= -INFINITY) {
LAB_002b77ca:
        local_48._M_impl.super__Vector_impl_data._M_start[uVar11] = 0.0;
      }
      else {
LAB_002b779b:
        HighsCDouble::operator-=(&local_58,dVar13 * dVar12);
      }
    }
  }
  piVar4 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar4;
  }
  pdVar5 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar5) {
    (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar5;
  }
  local_98 = inds;
  local_7c = CONCAT31(in_register_00000089,extractCliques);
  std::vector<int,_std::allocator<int>_>::reserve(inds,(long)(this->lpsolver).model_.lp_.num_col_);
  std::vector<double,_std::allocator<double>_>::reserve
            (pvVar8,(long)(this->lpsolver).model_.lp_.num_col_);
  iVar9 = 0;
  while (pvVar8 = local_88, iVar2 = (this->lpsolver).model_.lp_.num_col_, local_9c = iVar9,
        iVar9 != iVar2) {
    piVar4 = (this->lpsolver).model_.lp_.a_matrix_.start_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    iVar3 = piVar4[(long)iVar9 + 1];
    local_70.hi = (this->lpsolver).model_.lp_.col_cost_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar9];
    local_70.lo = 0.0;
    for (lVar10 = (long)piVar4[iVar9]; iVar3 != lVar10; lVar10 = lVar10 + 1) {
      dVar13 = local_48._M_impl.super__Vector_impl_data._M_start
               [(this->lpsolver).model_.lp_.a_matrix_.index_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar10]];
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        HighsCDouble::operator-=
                  (&local_70,
                   dVar13 * (this->lpsolver).model_.lp_.a_matrix_.value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar10]);
      }
    }
    local_60 = local_70.hi + local_70.lo;
    pHVar6 = this->mipsolver;
    if ((pHVar6->options_mip_->super_HighsOptionsStruct).small_matrix_value < ABS(local_60)) {
      dVar13 = ((pHVar6->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      if (ABS(local_60) <= dVar13) {
LAB_002b794e:
        if (0.0 <= local_60) {
          dVar13 = (local_90->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[local_9c];
          if (dVar13 <= -INFINITY) goto LAB_002b7a63;
        }
        else {
          dVar13 = (local_90->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[local_9c];
          if (INFINITY <= dVar13) goto LAB_002b7a63;
        }
        HighsCDouble::operator-=(&local_58,local_60 * dVar13);
      }
      else {
        lVar10 = (long)local_9c;
        dVar12 = (local_90->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
        dVar1 = (local_90->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        if (((dVar12 == dVar1) && (!NAN(dVar12) && !NAN(dVar1))) ||
           ((pHVar6->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] == kContinuous)) {
          dVar14 = (this->lpsolver).solution_.col_value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
          if (local_60 <= 0.0) {
            dVar14 = dVar1 - dVar14;
          }
          else {
            dVar14 = dVar14 - dVar12;
          }
          if (dVar14 <= dVar13) goto LAB_002b794e;
        }
        std::vector<double,_std::allocator<double>_>::push_back(local_88,&local_60);
        std::vector<int,_std::allocator<int>_>::push_back(local_98,&local_9c);
      }
    }
    iVar9 = local_9c + 1;
  }
  *local_78 = local_58.hi + local_58.lo;
  pHVar7 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  HighsDomain::tightenCoefficients
            (local_90,pHVar7,
             (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (HighsInt)
             ((ulong)((long)(local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pHVar7) >> 2),local_78);
  if ((char)local_7c != '\0') {
    pHVar7 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    HighsCliqueTable::extractCliquesFromCut
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cliquetable,
               this->mipsolver,pHVar7,
               (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (HighsInt)
               ((ulong)((long)(local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)pHVar7) >> 2),*local_78);
  }
LAB_002b7a63:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return iVar9 == iVar2;
}

Assistant:

bool HighsLpRelaxation::computeDualProof(const HighsDomain& globaldomain,
                                         double upperbound,
                                         std::vector<HighsInt>& inds,
                                         std::vector<double>& vals, double& rhs,
                                         bool extractCliques) const {
#if 0
  const HighsBasis& basis = lpsolver.getBasis();
  const HighsSolution& sol = lpsolver.getSolution();
  HighsCDouble proofRhs = upperbound;
  assert(lpsolver.getInfo().max_dual_infeasibility <=
         mipsolver.mipdata_->feastol);

  proofRhs -= lpsolver.getInfo().objective_function_value;
  inds.clear();
  vals.clear();
  double maxVal = 0.0;
  double maxValGlb = 0.0;
  double sumLocal = 0.0;
  HighsInt numLocalCols = 0;
  const HighsInt numCol = lpsolver.getNumCol();
  for (HighsInt i : mipsolver.mipdata_->integral_cols) {
    if (basis.col_status[i] == HighsBasisStatus::kBasic) continue;

    if (sol.col_dual[i] > kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_lower_[i]) {
        maxVal = std::max(sol.col_dual[i], maxVal);
        sumLocal += sol.col_dual[i];
        ++numLocalCols;
      }
    } else if (sol.col_dual[i] < -kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_upper_[i]) {
        maxVal = std::max(-sol.col_dual[i], maxVal);
        sumLocal += -sol.col_dual[i];
        ++numLocalCols;
      }
    } else
      continue;

    proofRhs += sol.col_value[i] * sol.col_dual[i];

    vals.push_back(sol.col_dual[i]);
    inds.push_back(i);
  }

  int expShift;
  std::frexp(maxVal - mipsolver.mipdata_->epsilon, &expShift);
  expShift = -expShift;

  HighsInt len = vals.size();

  double minGlbVal = numLocalCols == 0
                         ? 0.0
                         : std::ldexp(sumLocal / numLocalCols, expShift) -
                               mipsolver.mipdata_->feastol;

  for (HighsInt i = len - 1; i >= 0; --i) {
    HighsInt iCol = inds[i];
    double val = std::ldexp(vals[i], expShift);

    bool remove = false;

    double absVal = std::fabs(val);
    if (absVal <= mipsolver.mipdata_->feastol || globaldomain.isFixed(iCol)) {
      if (vals[i] > 0) {
        if (globaldomain.col_lower_[iCol] == -kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_lower_[iCol];
      } else {
        if (globaldomain.col_upper_[iCol] == kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_upper_[iCol];
      }

      remove = true;
    } else if (absVal < minGlbVal) {
      if (vals[i] > 0)
        remove = sol.col_value[iCol] == globaldomain.col_lower_[iCol];
      else
        remove = sol.col_value[iCol] == globaldomain.col_upper_[iCol];

      if (remove) proofRhs -= vals[i] * sol.col_value[iCol];
    }

    if (remove) {
      --len;
      vals[i] = vals[len];
      inds[i] = inds[len];
    } else {
      vals[i] = val;
    }
  }

  vals.resize(len);
  inds.resize(len);

  rhs = std::ldexp(double(proofRhs), expShift);

  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#else
  std::vector<double> row_dual = lpsolver.getSolution().row_dual;

  const HighsLp& lp = lpsolver.getLp();

  assert(std::isfinite(upperbound));
  HighsCDouble upper = upperbound;

  for (HighsInt i = 0; i != lp.num_row_; ++i) {
    // @FlipRowDual row_dual[i] < 0 became row_dual[i] > 0
    if (row_dual[i] > 0) {
      if (lp.row_lower_[i] != -kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_lower_[i];
      else
        row_dual[i] = 0;
      // @FlipRowDual row_dual[i] > 0 became row_dual[i] < 0
    } else if (row_dual[i] < 0) {
      if (lp.row_upper_[i] != kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_upper_[i];
      else
        row_dual[i] = 0;
    }
  }

  inds.clear();
  vals.clear();
  inds.reserve(lp.num_col_);
  vals.reserve(lp.num_col_);
  for (HighsInt i = 0; i != lp.num_col_; ++i) {
    HighsInt start = lp.a_matrix_.start_[i];
    HighsInt end = lp.a_matrix_.start_[i + 1];

    HighsCDouble sum = lp.col_cost_[i];

    for (HighsInt j = start; j != end; ++j) {
      if (row_dual[lp.a_matrix_.index_[j]] == 0) continue;
      // @FlipRowDual += became -=
      sum -= lp.a_matrix_.value_[j] * row_dual[lp.a_matrix_.index_[j]];
    }

    double val = double(sum);

    if (std::fabs(val) <= mipsolver.options_mip_->small_matrix_value) continue;

    bool removeValue = std::fabs(val) <= mipsolver.mipdata_->feastol;

    if (!removeValue &&
        (globaldomain.col_lower_[i] == globaldomain.col_upper_[i] ||
         mipsolver.variableType(i) == HighsVarType::kContinuous)) {
      if (val > 0)
        removeValue =
            lpsolver.getSolution().col_value[i] - globaldomain.col_lower_[i] <=
            mipsolver.mipdata_->feastol;
      else
        removeValue =
            globaldomain.col_upper_[i] - lpsolver.getSolution().col_value[i] <=
            mipsolver.mipdata_->feastol;
    }

    if (removeValue) {
      if (val < 0) {
        if (globaldomain.col_upper_[i] == kHighsInf) return false;
        upper -= val * globaldomain.col_upper_[i];
      } else {
        if (globaldomain.col_lower_[i] == -kHighsInf) return false;

        upper -= val * globaldomain.col_lower_[i];
      }

      continue;
    }

    vals.push_back(val);
    inds.push_back(i);
  }

  rhs = double(upper);
  assert(std::isfinite(rhs));
  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#endif
}